

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<BoolView>::~vec(vec<BoolView> *this)

{
  BoolView *__ptr;
  long lVar1;
  uint i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; __ptr = this->data, uVar2 < this->sz; uVar2 = uVar2 + 1) {
    (**(code **)(*(long *)((long)&(__ptr->super_Var).super_Branching._vptr_Branching + lVar1) + 0x28
                ))((long)&(__ptr->super_Var).super_Branching._vptr_Branching + lVar1);
    lVar1 = lVar1 + 0x10;
  }
  free(__ptr);
  this->data = (BoolView *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}